

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

bool __thiscall
Clasp::Cli::ClaspCliConfig::setAppDefaults
          (ClaspCliConfig *this,ConfigKey config,uint8 mode,ParsedOpts *seen,ProblemType t)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  BasicSatConfig *pBVar5;
  undefined4 extraout_var;
  ConfigIter *in_RCX;
  uint8 in_DL;
  int in_ESI;
  int in_R8D;
  string mem;
  char *in_stack_00000bf0;
  uint32 in_stack_00000bfc;
  uint8 in_stack_00000c03;
  int in_stack_00000c04;
  ClaspCliConfig *in_stack_00000c08;
  undefined7 in_stack_ffffffffffffff18;
  uint8 in_stack_ffffffffffffff1f;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined8 in_stack_ffffffffffffff28;
  ConfigKey k;
  string *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  ClaspCliConfig *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  size_t in_stack_ffffffffffffff68;
  ConfigIter *in_stack_ffffffffffffff70;
  ClaspCliConfig *in_stack_ffffffffffffff78;
  string local_40 [36];
  int local_1c;
  undefined8 local_18;
  uint8 local_d;
  int local_c;
  
  k = (ConfigKey)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  iVar3 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_1c = in_R8D;
  local_18 = in_RCX;
  local_d = in_DL;
  local_c = in_ESI;
  std::__cxx11::string::string(local_40);
  if (local_1c != 2) {
    getOptionName(in_stack_ffffffffffffff58,iVar3,in_stack_ffffffffffffff48);
    sVar4 = Potassco::ProgramOptions::ParsedOptions::count
                      ((ParsedOptions *)
                       CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                       (string *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    if ((sVar4 == 0) &&
       (iVar2 = setOption(in_stack_00000c08,in_stack_00000c04,in_stack_00000c03,in_stack_00000bfc,
                          in_stack_00000bf0), iVar2 == 0)) {
      Potassco::fail(-2,
                     "bool Clasp::Cli::ClaspCliConfig::setAppDefaults(ConfigKey, uint8, const ParsedOpts &, ProblemType)"
                     ,0x442,"setOption(opt_sat_prepro, mode, 0, \"2,iter=20,occ=25,time=120\")",
                     (char *)0x0);
    }
  }
  bVar1 = isTester(local_d);
  if (((!bVar1) && (local_c == 0x13)) && (local_1c == 2)) {
    in_stack_ffffffffffffff70 = local_18;
    in_stack_ffffffffffffff78 =
         (ClaspCliConfig *)getOptionName(in_stack_ffffffffffffff58,iVar3,in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff68 =
         Potassco::ProgramOptions::ParsedOptions::count
                   ((ParsedOptions *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                    (string *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    if ((in_stack_ffffffffffffff68 == 0) &&
       (in_stack_ffffffffffffff64 =
             setOption(in_stack_00000c08,in_stack_00000c04,in_stack_00000c03,in_stack_00000bfc,
                       in_stack_00000bf0), in_stack_ffffffffffffff64 == 0)) {
      Potassco::fail(-2,
                     "bool Clasp::Cli::ClaspCliConfig::setAppDefaults(ConfigKey, uint8, const ParsedOpts &, ProblemType)"
                     ,0x445,
                     "seen.count(getOptionName(opt_eq, mem)) || setOption(opt_eq, mode, 0, \"3\")",
                     (char *)0x0);
    }
    in_stack_ffffffffffffff58 =
         (ClaspCliConfig *)
         getOptionName(in_stack_ffffffffffffff58,local_18._4_4_,in_stack_ffffffffffffff48);
    sVar4 = Potassco::ProgramOptions::ParsedOptions::count
                      ((ParsedOptions *)
                       CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                       (string *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    if ((sVar4 == 0) &&
       (iVar3 = setOption(in_stack_00000c08,in_stack_00000c04,in_stack_00000c03,in_stack_00000bfc,
                          in_stack_00000bf0), iVar3 == 0)) {
      Potassco::fail(-2,
                     "bool Clasp::Cli::ClaspCliConfig::setAppDefaults(ConfigKey, uint8, const ParsedOpts &, ProblemType)"
                     ,0x446,
                     "seen.count(getOptionName(opt_trans_ext, mem)) || setOption(opt_trans_ext, mode, 0, \"dynamic\")"
                     ,(char *)0x0);
    }
  }
  if (local_c != 0x10) {
    pBVar5 = active((ClaspConfig *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                    in_stack_ffffffffffffff1f);
    iVar3 = (*(pBVar5->super_UserConfiguration).super_Configuration._vptr_Configuration[6])
                      (pBVar5,0);
    if (((uint)((ulong)*(undefined8 *)CONCAT44(extraout_var,iVar3) >> 0x33) & 1) == 1) {
      getConfig(k);
      bVar1 = setConfig(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                        (uint8)(in_stack_ffffffffffffff68 >> 0x38),(uint32)in_stack_ffffffffffffff68
                        ,(ParsedOpts *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                        ,(ParsedOpts *)in_stack_ffffffffffffff58);
      if (!bVar1) {
        Potassco::fail(-2,
                       "bool Clasp::Cli::ClaspCliConfig::setAppDefaults(ConfigKey, uint8, const ParsedOpts &, ProblemType)"
                       ,0x449,
                       "setConfig(getConfig(config_nolearn), mode | mode_relaxed, 0, seen, 0)",
                       (char *)0x0);
      }
    }
  }
  std::__cxx11::string::~string(local_40);
  return true;
}

Assistant:

bool ClaspCliConfig::setAppDefaults(ConfigKey config, uint8 mode, const ParsedOpts& seen, ProblemType t) {
	std::string mem;
	if (t != Problem_t::Asp && !seen.count(getOptionName(opt_sat_prepro, mem))) {
		POTASSCO_REQUIRE(setOption(opt_sat_prepro, mode, 0, "2,iter=20,occ=25,time=120"));
	}
	if (!isTester(mode) && config == config_many && t == Problem_t::Asp) {
		POTASSCO_REQUIRE(seen.count(getOptionName(opt_eq, mem)) || setOption(opt_eq, mode, 0, "3"));
		POTASSCO_REQUIRE(seen.count(getOptionName(opt_trans_ext, mem)) || setOption(opt_trans_ext, mode, 0, "dynamic"));
	}
	if (config != config_nolearn && active(this, mode)->solver(0).search == SolverParams::no_learning) {
		POTASSCO_REQUIRE(setConfig(getConfig(config_nolearn), mode | mode_relaxed, 0, seen, 0));
	}
	return true;
}